

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

long calculator::toBase<long,2ul>(string *s)

{
  stringstream ss;
  long local_198;
  stringstream local_190 [392];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::bitset<32ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
            ((bitset<32ul> *)&local_198,s,0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return local_198;
}

Assistant:

inline T toBase(const std::string& s) {
    std::stringstream ss;
    if (Base == 16)
        ss << std::hex << s;
    else if (Base == 8)
        ss << std::oct << s;
    else if (Base == 2)
        return std::bitset<32>(s).to_ulong();
    T v;
    ss >> v;
    return v;
}